

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::doAddCol
          (SPxLPBase<double> *this,double *objValue,double *lowerValue,SVectorBase<double> *colVec,
          double *upperValue,bool scale)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  Item *pIVar4;
  Nonzero<double> *pNVar5;
  bool bVar6;
  double dVar7;
  undefined7 in_register_00000089;
  double dVar8;
  int iVar9;
  long in_FS_OFFSET;
  int idx;
  double val;
  LPRowBase<double> empty;
  int local_a4;
  int local_a0;
  undefined4 local_9c;
  Item *local_98;
  int local_8c;
  double local_88;
  undefined8 uStack_80;
  DataKey local_78;
  double local_70;
  LPRowBase<double> local_68;
  
  local_9c = (undefined4)CONCAT71(in_register_00000089,scale);
  local_a4 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_8c = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_78 = (DataKey)((ulong)local_78 & 0xffffffff00000000);
  local_68.left = -NAN;
  LPColSetBase<double>::add
            (&this->super_LPColSetBase<double>,(DataKey *)&local_68,objValue,lowerValue,colVec,
             upperValue,&local_78.info);
  if (this->thesense != MAXIMIZE) {
    pdVar3 = (this->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3[local_a4] = -pdVar3[local_a4];
  }
  local_a0 = 0;
  if ((char)local_9c != '\0') {
    local_a0 = (*this->lp_scaler->_vptr_SPxScaler[1])
                         (this->lp_scaler,colVec,&(this->super_LPRowSetBase<double>).scaleExp);
    local_88 = (this->super_LPColSetBase<double>).up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[local_a4];
    ::soplex::infinity::__tls_init();
    dVar8 = *(double *)(in_FS_OFFSET + -8);
    uStack_80 = 0;
    bVar6 = local_88 < dVar8;
    local_88 = dVar8;
    if (bVar6) {
      dVar8 = ldexp((this->super_LPColSetBase<double>).up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_a4],-local_a0);
      (this->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[local_a4] = dVar8;
    }
    local_98 = (Item *)(this->super_LPColSetBase<double>).low.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[local_a4];
    ::soplex::infinity::__tls_init();
    if (-local_88 < (double)local_98) {
      dVar8 = ldexp((this->super_LPColSetBase<double>).low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_a4],-local_a0);
      (this->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl.super__Vector_impl_data._M_start[local_a4] = dVar8;
    }
    iVar2 = local_a0;
    dVar8 = ldexp((this->super_LPColSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[local_a4],local_a0);
    (this->super_LPColSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [local_a4] = dVar8;
    (this->super_LPColSetBase<double>).scaleExp.data[local_a4] = iVar2;
  }
  pIVar4 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[local_a4].idx;
  dVar8 = (double)(long)pIVar4[iVar2].data.super_SVectorBase<double>.memused;
  if (0 < (long)dVar8) {
    local_98 = pIVar4 + iVar2;
    do {
      dVar1 = (double)((long)dVar8 + -1);
      pNVar5 = (local_98->data).super_SVectorBase<double>.m_elem;
      iVar2 = pNVar5[(long)dVar1].idx;
      local_88 = dVar1;
      if ((char)local_9c != '\0') {
        dVar7 = ldexp(pNVar5[(long)dVar1].val,
                      (this->super_LPRowSetBase<double>).scaleExp.data[iVar2] + local_a0);
        (local_98->data).super_SVectorBase<double>.m_elem[(long)dVar1].val = dVar7;
      }
      local_70 = (local_98->data).super_SVectorBase<double>.m_elem[(long)dVar1].val;
      if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar2) {
        LPRowBase<double>::LPRowBase(&local_68,0);
        iVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (iVar9 <= iVar2) {
          iVar9 = (iVar2 - iVar9) + 1;
          do {
            local_78.info = 0;
            local_78.idx = -1;
            LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,&local_78,&local_68);
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
        if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
          free(local_68.vec.theelem);
          local_68.vec.theelem = (Nonzero<double> *)0x0;
        }
      }
      SVSetBase<double>::add2
                ((SVSetBase<double> *)this,
                 (SVectorBase<double> *)
                 ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx),1
                 ,&local_a4,&local_70);
      bVar6 = 1 < (long)dVar8;
      dVar8 = local_88;
    } while (bVar6);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - local_8c));
  return;
}

Assistant:

void doAddCol(const R& objValue, const R& lowerValue, const SVectorBase<R>& colVec,
                 const R& upperValue, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(objValue, lowerValue, colVec, upperValue);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(colVec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      SVectorBase<R>& vec = colVector_w(idx);

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }